

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmpfile.c
# Opt level: O0

FILE * tmpfile(void)

{
  uint uVar1;
  uint local_30;
  int local_2c;
  uint random;
  _PDCLIB_fd_t fd;
  char *filename;
  _PDCLIB_file_t *p_Stack_18;
  int randomsource;
  FILE *rc;
  
  filename._4_4_ = open("/dev/urandom",0);
  _random = (char *)malloc(0x2e);
  if (filename._4_4_ == -1) {
    rc = (FILE *)0x0;
  }
  else {
    while( true ) {
      read(filename._4_4_,&local_30,4);
      sprintf(_random,"/tmp/%u.tmp",(ulong)local_30);
      local_2c = open(_random,0xc2,0x180);
      if (local_2c != -1) break;
      close(-1);
    }
    close(filename._4_4_);
    p_Stack_18 = _PDCLIB_init_file_t((_PDCLIB_file_t *)0x0);
    if (p_Stack_18 == (_PDCLIB_file_t *)0x0) {
      close(local_2c);
      rc = (FILE *)0x0;
    }
    else {
      uVar1 = _PDCLIB_filemode("wb+");
      p_Stack_18->status = uVar1 | 0x2002 | p_Stack_18->status;
      p_Stack_18->handle = local_2c;
      p_Stack_18->filename = _random;
      mtx_lock(&_PDCLIB_filelist_mtx);
      p_Stack_18->next = _PDCLIB_filelist;
      _PDCLIB_filelist = p_Stack_18;
      mtx_unlock(&_PDCLIB_filelist_mtx);
      rc = p_Stack_18;
    }
  }
  return (FILE *)rc;
}

Assistant:

struct _PDCLIB_file_t * tmpfile( void )
{
    FILE * rc;
    /* This is the chosen way to get high-quality randomness. Replace as
       appropriate.
    */
    int randomsource = open( "/dev/urandom", O_RDONLY );
    /* Working under the assumption that the tempfile location is canonical
       (absolute), and does not require going through _PDCLIB_realpath().
    */
    char * filename = ( char * )malloc( L_tmpnam );
    _PDCLIB_fd_t fd;

    if ( randomsource == -1 )
    {
        return NULL;
    }

    for ( ;; )
    {
        /* Get a filename candidate. What constitutes a valid filename and
           where temporary files are usually located is platform-dependent,
           which is one reason why this function is located in the platform
           overlay. The other reason is that a *good* implementation should
           use high-quality randomness instead of a pseudo-random sequence to
           generate the filename candidate, which is *also* platform-dependent.
        */
        unsigned int random;
        read( randomsource, (void *)&random, sizeof( unsigned int ) );
        sprintf( filename, "/tmp/%u.tmp", random );
        /* Check if file of this name exists. Note that fopen() is a very weak
           check, which does not take e.g. access permissions into account
           (file might exist but not readable). Replace with something more
           appropriate.
        */
        fd = open( filename, O_CREAT | O_EXCL | O_RDWR, S_IRUSR | S_IWUSR );

        if ( fd != -1 )
        {
            /* Found a file that does not exist yet */
            break;
        }

        close( fd );
    }

    close( randomsource );

    /* See fopen(), which does much of the same. */

    if ( ( rc = _PDCLIB_init_file_t( NULL ) ) == NULL )
    {
        /* initializing FILE structure failed */
        close( fd );
        return NULL;
    }

    rc->status |= _PDCLIB_filemode( "wb+" ) | _IOLBF | _PDCLIB_DELONCLOSE;
    rc->handle = fd;

    /* Filename (for potential freopen()) */
    rc->filename = filename;

    /* Adding to list of open files */
    _PDCLIB_LOCK( _PDCLIB_filelist_mtx );
    rc->next = _PDCLIB_filelist;
    _PDCLIB_filelist = rc;
    _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
    return rc;
}